

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall clask::response_writer::write_headers(response_writer *this)

{
  pointer ppVar1;
  pointer pcVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  long *plVar5;
  long *plVar6;
  pointer ppVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hh;
  __string_type res_headers;
  ostringstream os;
  long *local_228 [2];
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  int local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this->header_out = true;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"HTTP/1.1 ",9);
  poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->code);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pmVar4 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)status_codes_abi_cxx11_,&this->code);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__cxx11::stringbuf::str();
  send(this->s,local_1c8,(long)local_1c0,0x4000);
  ppVar7 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar7 != ppVar1) {
    do {
      local_228[0] = local_218;
      pcVar2 = (ppVar7->first)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,pcVar2,pcVar2 + (ppVar7->first)._M_string_length);
      std::__cxx11::string::append((char *)local_228);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_228,(ulong)(ppVar7->second)._M_dataplus._M_p);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_1d8 = *plVar6;
        lStack_1d0 = plVar5[3];
        local_1e8 = &local_1d8;
      }
      else {
        local_1d8 = *plVar6;
        local_1e8 = (long *)*plVar5;
      }
      local_1e0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_1f8 = *plVar6;
        lStack_1f0 = plVar5[3];
        local_208 = &local_1f8;
      }
      else {
        local_1f8 = *plVar6;
        local_208 = (long *)*plVar5;
      }
      local_200 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_228[0] != local_218) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
      send(this->s,local_208,(long)(int)local_200,0x4000);
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar1);
  }
  send(this->s,"\r\n",2,0x4000);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

inline void response_writer::write_headers() {
  header_out = true;
  std::ostringstream os;
  os << "HTTP/1.1 " << code << " " << status_codes[code] << "\r\n";
  auto res_headers = os.str();
  send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
  for (auto& h : headers) {
    auto hh = h.first + ": " + h.second + "\r\n";
    send(s, hh.data(), (int) hh.size(), MSG_NOSIGNAL);
  }
  send(s, "\r\n", 2, MSG_NOSIGNAL);
}